

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAttachBottom(Abc_Ntk_t *pNtkTop,Abc_Ntk_t *pNtkBottom)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (pNtkBottom == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtkBottom != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                  ,0x330,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkTop != (Abc_Ntk_t *)0x0) {
    iVar3 = pNtkTop->vPis->nSize;
    if (iVar3 != pNtkTop->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x334,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar5 = pNtkBottom->vPis->nSize;
    if (iVar5 != pNtkBottom->vCis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x335,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtkBottom->vPos->nSize != iVar3) {
      __assert_fail("Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (iVar3 <= iVar5) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) < Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x338,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkPi(pNtkTop,iVar5);
      pAVar2 = Abc_NtkCreateNodeBuf(pNtkTop,(Abc_Obj_t *)0x0);
      Abc_ObjTransferFanout(pAVar1,pAVar2);
      pAVar1 = Abc_NtkPo(pNtkBottom,iVar5);
      (pAVar1->field_6).pCopy = pAVar2;
      iVar3 = pNtkTop->vPis->nSize;
    }
    while (iVar5 = pNtkBottom->vPis->nSize, iVar5 < iVar3) {
      iVar3 = iVar3 + -1;
      pAVar1 = Abc_NtkPi(pNtkTop,iVar3);
      Abc_NtkDeleteObj(pAVar1);
    }
    if (iVar5 != pNtkTop->vPis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x343,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    for (iVar3 = 0; iVar3 < iVar5; iVar3 = iVar3 + 1) {
      Abc_NtkPi(pNtkBottom,iVar3);
      pAVar1 = Abc_NtkPi(pNtkTop,iVar3);
      pAVar2 = Abc_NtkPi(pNtkBottom,iVar3);
      (pAVar2->field_6).pCopy = pAVar1;
      iVar5 = pNtkBottom->vPis->nSize;
    }
    p = Abc_NtkDfs(pNtkBottom,0);
    for (iVar3 = 0; iVar3 < p->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar3);
      Abc_NtkDupObj(pNtkTop,pAVar1,0);
      for (lVar4 = 0; lVar4 < (pAVar1->vFanins).nSize; lVar4 = lVar4 + 1) {
        Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar4]] + 0x40)
                       );
      }
    }
    Vec_PtrFree(p);
    for (iVar3 = 0; iVar3 < pNtkBottom->vPos->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = Abc_NtkPo(pNtkBottom,iVar3);
      Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                      *(Abc_Obj_t **)
                       ((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x40));
    }
    Abc_NtkDelete(pNtkBottom);
    iVar3 = Abc_NtkCheck(pNtkTop);
    pNtkBottom = pNtkTop;
    if (iVar3 == 0) {
      fwrite("Abc_NtkAttachBottom(): Network check has failed.\n",0x31,1,_stdout);
    }
  }
  return pNtkBottom;
}

Assistant:

Abc_Ntk_t * Abc_NtkAttachBottom( Abc_Ntk_t * pNtkTop, Abc_Ntk_t * pNtkBottom )
{
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( pNtkBottom != NULL );
    if ( pNtkTop == NULL )
        return pNtkBottom;
    // make sure the networks are combinational
    assert( Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom) );
    // make sure the POs of the bottom correspond to the PIs of the top
    assert( Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) <  Abc_NtkPiNum(pNtkTop) );
    // add buffers for the PIs of the top - save results in the POs of the bottom
    Abc_NtkForEachPi( pNtkTop, pObj, i )
    {
        pBuffer = Abc_NtkCreateNodeBuf( pNtkTop, NULL );
        Abc_ObjTransferFanout( pObj, pBuffer );
        Abc_NtkPo(pNtkBottom, i)->pCopy = pBuffer;
    }
    // remove useless PIs of the top
    for ( i = Abc_NtkPiNum(pNtkTop) - 1; i >= Abc_NtkPiNum(pNtkBottom); i-- )
        Abc_NtkDeleteObj( Abc_NtkPi(pNtkTop, i) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    // copy the bottom network
    Abc_NtkForEachPi( pNtkBottom, pObj, i )
        Abc_NtkPi(pNtkBottom, i)->pCopy = Abc_NtkPi(pNtkTop, i);
    // construct all nodes
    vNodes = Abc_NtkDfs( pNtkBottom, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj(pNtkTop, pObj, 0);
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // connect the POs
    Abc_NtkForEachPo( pNtkBottom, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
    // delete old network
    Abc_NtkDelete( pNtkBottom );
    // return the network
    if ( !Abc_NtkCheck( pNtkTop ) )
        fprintf( stdout, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkTop;
}